

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<float>::Add(TPZMatrix<float> *this,TPZMatrix<float> *A,TPZMatrix<float> *res)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZMatrix<float> *aBase;
  TPZMatrix<float> *this_01;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int64_t c;
  int64_t r;
  TPZFMatrix<float> *resFmat;
  TPZFMatrix<float> *aFmat;
  TPZFMatrix<float> *thisFmat;
  size_t in_stack_00000228;
  char *in_stack_00000230;
  long local_1b8;
  float local_44;
  long local_40;
  long local_38;
  TPZMatrix<float> *local_30;
  long local_28;
  TPZMatrix<float> *local_20;
  long *local_18;
  TPZBaseMatrix *local_10;
  TPZFMatrix<float> *this_00;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  iVar7 = TPZBaseMatrix::Rows(local_10);
  if (iVar6 == iVar7) {
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    iVar7 = TPZBaseMatrix::Cols(local_10);
    if (iVar6 == iVar7) goto LAB_012f77d9;
  }
  Error(in_stack_00000010,in_stack_00000008);
LAB_012f77d9:
  iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  this_00 = (TPZFMatrix<float> *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (this_00 != (TPZFMatrix<float> *)CONCAT44(extraout_var_00,iVar5)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<float>::Add(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [TVar = float]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000230,in_stack_00000228);
  }
  (**(code **)(*local_18 + 0xf8))(local_18,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    aBase = (TPZMatrix<float> *)0x0;
  }
  else {
    aBase = (TPZMatrix<float> *)__dynamic_cast(in_RDI,&typeinfo,&TPZFMatrix<float>::typeinfo,0);
  }
  local_20 = aBase;
  if (local_10 == (TPZBaseMatrix *)0x0) {
    local_1b8 = 0;
  }
  else {
    local_1b8 = __dynamic_cast(local_10,&typeinfo,&TPZFMatrix<float>::typeinfo,0);
  }
  local_28 = local_1b8;
  if (local_18 == (long *)0x0) {
    this_01 = (TPZMatrix<float> *)0x0;
  }
  else {
    this_01 = (TPZMatrix<float> *)__dynamic_cast(local_18,&typeinfo,&TPZFMatrix<float>::typeinfo,0);
  }
  local_30 = this_01;
  if ((this_01 == (TPZMatrix<float> *)0x0) ||
     ((local_20 != (TPZMatrix<float> *)0x0 && (local_28 != 0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,local_18,local_10);
    Storage(this_01);
    Storage(this_01);
    TPZFMatrix<float>::operator+=(this_00,aBase);
    TPZFMatrixRef<float>::~TPZFMatrixRef((TPZFMatrixRef<float> *)0x12f7b0e);
    TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12f7b1b);
  }
  else {
    for (local_38 = 0; lVar1 = local_38, iVar6 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar6;
        local_38 = local_38 + 1) {
      for (local_40 = 0; lVar1 = local_40, iVar6 = TPZBaseMatrix::Cols(in_RDI), plVar4 = local_18,
          lVar3 = local_38, lVar2 = local_40, lVar1 < iVar6; local_40 = local_40 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_38,local_40);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_38,local_40);
        local_44 = extraout_XMM0_Da + extraout_XMM0_Da_00;
        (**(code **)(*plVar4 + 0x118))(plVar4,lVar3,lVar2,&local_44);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Add(const TPZMatrix<TVar>&A,TPZMatrix<TVar>&res) const {
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix) <different dimensions>" );
	}
  if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)+A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() += A.Storage();
  }
  
}